

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

char * trex_matchnode(TRex *exp,TRexNode *node,char *str,TRexNode *next)

{
  uint uVar1;
  char cVar2;
  ushort *puVar3;
  TRexMatch *pTVar4;
  bool bVar5;
  TRexBool TVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ushort **ppuVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  TRexNode *pTVar15;
  int iVar16;
  TRexNode *pTVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  
  iVar10 = node->type;
  switch(iVar10) {
  case 0x100:
    pTVar17 = next;
    if ((long)node->next != -1) {
      pTVar17 = exp->_nodes + node->next;
    }
    uVar14 = (uint)node->right >> 0x10;
    uVar18 = node->right & 0xffff;
    uVar19 = 0;
    pcVar12 = str;
    do {
      if ((int)uVar18 <= (int)uVar19 && uVar19 != 0xffff) break;
      pcVar12 = trex_matchnode(exp,exp->_nodes + node->left,pcVar12,pTVar17);
      if (pcVar12 == (char *)0x0) {
        bVar20 = true;
      }
      else {
        uVar1 = uVar19 + 1;
        str = pcVar12;
        if ((pTVar17 != (TRexNode *)0x0) &&
           ((pTVar17->type != 0x100 || (0xffff < (uint)pTVar17->right)))) {
          iVar10 = pTVar17->next;
          if ((iVar10 == -1) && ((next == (TRexNode *)0x0 || (iVar10 = next->next, iVar10 == -1))))
          {
            pTVar15 = (TRexNode *)0x0;
          }
          else {
            pTVar15 = exp->_nodes + iVar10;
          }
          pcVar13 = trex_matchnode(exp,pTVar17,pcVar12,pTVar15);
          if (pcVar13 == (char *)0x0) {
LAB_00106a3b:
            bVar20 = false;
            bVar5 = true;
          }
          else {
            bVar20 = true;
            if (uVar14 != uVar1 || uVar14 != uVar18) {
              if (((int)uVar1 < (int)uVar14) || (uVar18 != 0xffff && (int)uVar18 <= (int)uVar19))
              goto LAB_00106a3b;
            }
            bVar5 = false;
          }
          uVar19 = uVar1;
          if (!bVar5) goto LAB_00106a51;
        }
        bVar20 = exp->_eol <= pcVar12;
        uVar19 = uVar1;
      }
LAB_00106a51:
    } while (!bVar20);
    if ((uVar14 != uVar19 || uVar14 != uVar18) && (uVar18 != 0xffff || (int)uVar19 < (int)uVar14)) {
      if ((int)uVar18 < (int)uVar19) {
        str = (char *)0x0;
      }
      if ((int)uVar19 < (int)uVar14) {
        str = (char *)0x0;
      }
    }
    break;
  case 0x101:
    pTVar17 = exp->_nodes + node->left;
    pcVar12 = str;
    while (pcVar12 = trex_matchnode(exp,pTVar17,pcVar12,(TRexNode *)0x0), pcVar12 != (char *)0x0) {
      if ((long)pTVar17->next == -1) {
        return pcVar12;
      }
      pTVar17 = exp->_nodes + pTVar17->next;
    }
    pTVar17 = exp->_nodes + node->right;
    pcVar12 = trex_matchnode(exp,pTVar17,str,(TRexNode *)0x0);
    str = (char *)0x0;
    if (pcVar12 != (char *)0x0) {
      do {
        if ((long)pTVar17->next == -1) {
          return pcVar12;
        }
        pTVar17 = exp->_nodes + pTVar17->next;
        pcVar12 = trex_matchnode(exp,pTVar17,pcVar12,(TRexNode *)0x0);
        str = (char *)0x0;
      } while (pcVar12 != (char *)0x0);
    }
    break;
  case 0x102:
  case 0x103:
    pTVar17 = exp->_nodes + node->left;
    iVar9 = -1;
    if ((iVar10 != 0x103) && (iVar10 = exp->_currsubexp, node->right == iVar10)) {
      exp->_matches[iVar10].begin = str;
      exp->_currsubexp = iVar10 + 1;
      iVar9 = iVar10;
    }
    do {
      pTVar15 = next;
      if ((long)pTVar17->next != -1) {
        pTVar15 = exp->_nodes + pTVar17->next;
      }
      str = trex_matchnode(exp,pTVar17,str,pTVar15);
      if (str == (char *)0x0) {
        if (iVar9 == -1) {
          return (char *)0x0;
        }
        pTVar4 = exp->_matches;
        pTVar4[iVar9].begin = (char *)0x0;
        pTVar4[iVar9].len = 0;
        return (char *)0x0;
      }
    } while (((long)pTVar17->next != -1) &&
            (pTVar17 = exp->_nodes + pTVar17->next, exp->_nodes != (TRexNode *)0x0));
    if (iVar9 != -1) {
      exp->_matches[iVar9].len = (int)str - *(int *)&exp->_matches[iVar9].begin;
    }
    break;
  case 0x104:
    goto switchD_00106679_caseD_104;
  case 0x105:
  case 0x107:
    pTVar17 = exp->_nodes;
    iVar9 = node->left;
    cVar2 = *str;
    iVar16 = (int)cVar2;
    do {
      iVar8 = pTVar17[iVar9].type;
      if (iVar8 == 0x106) {
        TVar6 = trex_matchcclass(pTVar17[iVar9].left,cVar2);
        if (TVar6 != 0) {
LAB_00106808:
          if (iVar10 != 0x105) {
            return (char *)0x0;
          }
          goto switchD_00106679_caseD_104;
        }
      }
      else if (iVar8 == 0x108) {
        iVar8 = pTVar17[iVar9].left;
        if ((exp->_flags & 1) == 0) {
          if (iVar8 <= iVar16) {
            iVar8 = pTVar17[iVar9].right;
joined_r0x00106771:
            if (iVar16 <= iVar8) goto LAB_00106808;
          }
        }
        else {
          iVar7 = toupper(iVar8);
          if ((iVar7 <= iVar16) && (iVar7 = toupper(pTVar17[iVar9].right), iVar16 <= iVar7))
          goto LAB_00106808;
          iVar8 = tolower(iVar8);
          if (iVar8 <= iVar16) {
            iVar8 = tolower(pTVar17[iVar9].right);
            goto joined_r0x00106771;
          }
        }
      }
      else {
        if ((exp->_flags & 1) != 0) {
          iVar7 = tolower(iVar8);
          if (iVar7 == iVar16) goto LAB_00106808;
          iVar8 = toupper(iVar8);
        }
        if (iVar8 == iVar16) goto LAB_00106808;
      }
    } while ((pTVar17 != (TRexNode *)0x0) && (iVar9 = pTVar17[iVar9].next, iVar9 != -1));
    if (iVar10 != 0x107) {
      return (char *)0x0;
    }
    goto switchD_00106679_caseD_104;
  case 0x106:
    TVar6 = trex_matchcclass(node->left,*str);
    str = str + 1;
    if (TVar6 == 0) {
      str = (char *)0x0;
    }
    break;
  default:
    cVar2 = *str;
    if ((exp->_flags & 1) != 0) {
      iVar9 = tolower(iVar10);
      if (iVar9 == cVar2) goto switchD_00106679_caseD_104;
      iVar10 = toupper(iVar10);
    }
    if (iVar10 != cVar2) {
      return (char *)0x0;
    }
switchD_00106679_caseD_104:
    str = str + 1;
    break;
  case 0x10a:
    bVar20 = exp->_eol == str;
    goto LAB_001068be;
  case 0x10b:
    bVar20 = exp->_bol == str;
    goto LAB_001068be;
  case 0x10c:
    if (((exp->_bol != str) ||
        (ppuVar11 = __ctype_b_loc(), (*(byte *)((long)*ppuVar11 + (long)*str * 2 + 1) & 0x20) != 0))
       && ((exp->_eol != str ||
           (ppuVar11 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar11 + (long)str[-1] * 2 + 1) & 0x20) != 0)))) {
      ppuVar11 = __ctype_b_loc();
      puVar3 = *ppuVar11;
      if ((puVar3[*str] >> 0xd & 1) == 0) {
        if ((*(byte *)((long)puVar3 + (long)str[1] * 2 + 1) & 0x20) != 0) goto LAB_001068b0;
        if ((puVar3[*str] >> 0xd & 1) == 0) goto LAB_00106b6b;
      }
      if ((*(byte *)((long)puVar3 + (long)str[1] * 2 + 1) & 0x20) != 0) {
LAB_00106b6b:
        if (node->left == 0x62) {
          return (char *)0x0;
        }
        return str;
      }
    }
LAB_001068b0:
    bVar20 = node->left == 0x62;
LAB_001068be:
    if (!bVar20) {
      str = (char *)0x0;
    }
  }
  return str;
}

Assistant:

static const TRexChar * trex_matchnode(TRex * exp, TRexNode * node, const TRexChar * str, TRexNode * next) {

	TRexNodeType type = node->type;

	switch (type) {
		case OP_GREEDY: {
			//TRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
			TRexNode * greedystop = NULL;
			int p0 = (node->right >> 16) & 0x0000FFFF, p1 = node->right & 0x0000FFFF, nmaches = 0;
			const TRexChar * s = str, *good = str;

			if (node->next != -1) {
				greedystop = &exp->_nodes[node->next];
			} else {
				greedystop = next;
			}

			while ((nmaches == 0xFFFF || nmaches < p1)) {

				const TRexChar * stop;

				if (!(s = trex_matchnode(exp, &exp->_nodes[node->left], s, greedystop))) {
					break;
				}

				nmaches++;
				good = s;

				if (greedystop) {
					//checks that 0 matches satisfy the expression(if so skips)
					//if not would always stop(for instance if is a '?')
					if (greedystop->type != OP_GREEDY ||
							(greedystop->type == OP_GREEDY && ((greedystop->right >> 16) & 0x0000FFFF) != 0)) {
						TRexNode * gnext = NULL;

						if (greedystop->next != -1) {
							gnext = &exp->_nodes[greedystop->next];
						} else if (next && next->next != -1) {
							gnext = &exp->_nodes[next->next];
						}

						stop = trex_matchnode(exp, greedystop, s, gnext);

						if (stop) {
							//if satisfied stop it
							if (p0 == p1 && p0 == nmaches) {
								break;
							} else if (nmaches >= p0 && p1 == 0xFFFF) {
								break;
							} else if (nmaches >= p0 && nmaches <= p1) {
								break;
							}
						}
					}
				}

				if (s >= exp->_eol) {
					break;
				}
			}

			if (p0 == p1 && p0 == nmaches) {
				return good;
			} else if (nmaches >= p0 && p1 == 0xFFFF) {
				return good;
			} else if (nmaches >= p0 && nmaches <= p1) {
				return good;
			}

			return NULL;
		}

		case OP_OR: {
			const TRexChar * asd = str;
			TRexNode * temp = &exp->_nodes[node->left];

			while ( (asd = trex_matchnode(exp, temp, asd, NULL)) ) {
				if (temp->next != -1) {
					temp = &exp->_nodes[temp->next];
				} else {
					return asd;
				}
			}

			asd = str;
			temp = &exp->_nodes[node->right];

			while ( (asd = trex_matchnode(exp, temp, asd, NULL)) ) {
				if (temp->next != -1) {
					temp = &exp->_nodes[temp->next];
				} else {
					return asd;
				}
			}

			return NULL;
			break;
		}

		case OP_EXPR:
		case OP_NOCAPEXPR: {
			TRexNode * n = &exp->_nodes[node->left];
			const TRexChar * cur = str;
			int capture = -1;

			if (node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
				capture = exp->_currsubexp;
				exp->_matches[capture].begin = cur;
				exp->_currsubexp++;
			}

			do {
				TRexNode * subnext = NULL;

				if (n->next != -1) {
					subnext = &exp->_nodes[n->next];
				} else {
					subnext = next;
				}

				if (!(cur = trex_matchnode(exp, n, cur, subnext))) {
					if (capture != -1) {
						exp->_matches[capture].begin = 0;
						exp->_matches[capture].len = 0;
					}

					return NULL;
				}
			} while ((n->next != -1) && (n = &exp->_nodes[n->next]));

			if (capture != -1) {
				exp->_matches[capture].len = cur - exp->_matches[capture].begin;
			}

			return cur;
		}

		case OP_WB:
			if ((str == exp->_bol && !isspace(*str))
					|| ((str == exp->_eol && !isspace(*(str - 1))))
					|| ((!isspace(*str) && isspace(*(str + 1))))
					|| ((isspace(*str) && !isspace(*(str + 1)))) ) {
				return (node->left == 'b') ? str : NULL;
			}

			return (node->left == 'b') ? NULL : str;

		case OP_BOL:
			if (str == exp->_bol) {
				return str;
			}

			return NULL;

		case OP_EOL:
			if (str == exp->_eol) {
				return str;
			}

			return NULL;

		case OP_DOT:
			str++;
			return str;

		case OP_NCLASS:
		case OP_CLASS:
			if (trex_matchclass(exp, &exp->_nodes[node->left], *str) ? (type == OP_CLASS ? TRex_True : TRex_False) : (type == OP_NCLASS ? TRex_True : TRex_False)) {
				str++;
				return str;
			}

			return NULL;

		case OP_CCLASS:
			if (trex_matchcclass(node->left, *str)) {
				str++;
				return str;
			}

			return NULL;

		default: /* char */
			if (exp->_flags & TREX_ICASE) {
				if (*str != tolower(node->type) && *str != toupper(node->type)) {
					return NULL;
				}
			} else {
				if (*str != node->type) {
					return NULL;
				}
			}

			str++;
			return str;
	}

	return NULL;
}